

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_index_module.c
# Opt level: O3

ngx_int_t ngx_http_index_handler(ngx_http_request_t *r)

{
  long lVar1;
  u_char *clcf;
  code *pcVar2;
  long lVar3;
  u_char *__dest;
  ngx_int_t nVar4;
  ngx_int_t nVar5;
  void *__dest_00;
  u_char uVar6;
  size_t sVar7;
  char *fmt;
  uint err;
  undefined8 in_RSI;
  undefined8 uVar8;
  ngx_log_t *pnVar9;
  ngx_str_t *uri_00;
  ngx_uint_t level;
  ngx_http_core_loc_conf_t *clcf_00;
  size_t sVar10;
  u_char *puVar11;
  undefined1 auStack_1c8 [8];
  ngx_str_t uri;
  ngx_open_file_info_t local_158;
  long *plStack_e8;
  ngx_http_script_engine_t e;
  size_t local_80;
  size_t root;
  long *local_70;
  undefined1 local_68 [8];
  ngx_str_t dir;
  undefined1 local_48 [8];
  ngx_str_t path;
  
  if (((r->uri).data[(r->uri).len - 1] == '/') && ((r->method & 0xe) != 0)) {
    local_70 = (long *)r->loc_conf[ngx_http_index_module.ctx_index];
    dir.data = (u_char *)r->loc_conf[ngx_http_core_module.ctx_index];
    local_80 = 0;
    path.len = 0;
    if (((long *)*local_70)[1] != 0) {
      lVar1 = *(long *)*local_70;
      uVar8 = CONCAT71((int7)((ulong)in_RSI >> 8),1);
      __dest = (u_char *)0x0;
      root = 0;
      e.request = (ngx_http_request_t *)0x0;
      do {
        path.data._4_4_ = (uint)uVar8;
        uri_00 = (ngx_str_t *)(lVar1 + (long)e.request * 0x20);
        if (*(long *)(lVar1 + 0x10 + (long)e.request * 0x20) == 0) {
          if (*uri_00->data == '/') goto LAB_001666e6;
          sVar7 = local_70[1];
          sVar10 = uri_00->len;
        }
        else {
          e._64_8_ = 0;
          e.line.len = 0;
          e.line.data = (u_char *)0x0;
          e.buf.len = 0;
          e.buf.data = (u_char *)0x0;
          e.pos = (u_char *)0x0;
          e.sp = (ngx_http_variable_value_t *)0x0;
          e.ip = (u_char *)0x0;
          plStack_e8 = *(long **)uri_00[1].len;
          e.args = &DAT_00000001;
          pcVar2 = (code *)*plStack_e8;
          sVar10 = 1;
          e.status = (ngx_int_t)r;
          if (pcVar2 != (code *)0x0) {
            do {
              lVar3 = (*pcVar2)(&plStack_e8);
              sVar10 = sVar10 + lVar3;
              pcVar2 = (code *)*plStack_e8;
            } while (pcVar2 != (code *)0x0);
          }
          sVar7 = sVar10 + 0x10;
        }
        clcf_00 = (ngx_http_core_loc_conf_t *)dir.data;
        if (root < sVar7) {
          __dest = ngx_http_map_uri_to_path(r,(ngx_str_t *)local_48,&local_80,sVar7);
          if (__dest == (u_char *)0x0) {
            return -1;
          }
          root = (long)local_48 + (path.len - (long)__dest);
        }
        if (uri_00[1].data == (u_char *)0x0) {
          memcpy(__dest,uri_00->data,uri_00->len);
          local_48 = (undefined1  [8])(__dest + ~path.len + uri_00->len);
          clcf_00 = (ngx_http_core_loc_conf_t *)dir.data;
        }
        else {
          plStack_e8 = *(long **)uri_00[1].data;
          pcVar2 = (code *)*plStack_e8;
          e.ip = __dest;
          while (pcVar2 != (code *)0x0) {
            (*pcVar2)(&plStack_e8);
            pcVar2 = (code *)*plStack_e8;
          }
          if (*__dest == '/') {
            auStack_1c8 = (undefined1  [8])(sVar10 - 1);
            uri_00 = (ngx_str_t *)auStack_1c8;
            uri.len = (size_t)__dest;
            goto LAB_001666e6;
          }
          local_48 = (undefined1  [8])(e.ip + -path.len);
          *e.ip = '\0';
        }
        pnVar9 = r->connection->log;
        if ((pnVar9->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar9,0,"open index \"%V\"",(ngx_str_t *)local_48);
        }
        local_158.disable_symlinks_from = 0;
        local_158.failed = (char *)0x0;
        local_158.err = 0;
        local_158._60_4_ = 0;
        local_158.fs_size = 0;
        local_158.mtime = 0;
        local_158.size = 0;
        local_158.fd = 0;
        local_158._4_4_ = 0;
        local_158.uniq = 0;
        local_158.read_ahead = clcf_00->read_ahead;
        local_158.directio = clcf_00->directio;
        local_158.valid = clcf_00->open_file_cache_valid;
        local_158.min_uses = clcf_00->open_file_cache_min_uses;
        local_158._98_6_ = 0;
        local_158._96_2_ =
             ((ushort)(int)clcf_00->open_file_cache_errors & 1) * 0x20 +
             (short)(((uint)clcf_00->open_file_cache_events & 1) << 6) + 8;
        nVar4 = ngx_http_set_disable_symlinks(r,clcf_00,(ngx_str_t *)local_48,&local_158);
        if (nVar4 != 0) {
          return 500;
        }
        nVar4 = ngx_open_cached_file
                          (clcf_00->open_file_cache,(ngx_str_t *)local_48,&local_158,r->pool);
        if (nVar4 == 0) {
          auStack_1c8 = (undefined1  [8])((r->uri).len + (sVar10 - 1));
          if (*(long *)(dir.data + 0x50) == 0) {
            uri.len = path.len + local_80;
          }
          else {
            __dest_00 = ngx_pnalloc(r->pool,(size_t)auStack_1c8);
            if (__dest_00 == (void *)0x0) {
              return 500;
            }
            uri.len = (size_t)__dest_00;
            memcpy(__dest_00,(r->uri).data,(r->uri).len);
            memcpy((void *)((long)__dest_00 + (r->uri).len),__dest,sVar10 - 1);
          }
          uri_00 = (ngx_str_t *)auStack_1c8;
LAB_001666e6:
          nVar4 = ngx_http_internal_redirect(r,uri_00,&r->args);
          return nVar4;
        }
        if (local_158.err == 0) {
          return 500;
        }
        pnVar9 = r->connection->log;
        if ((pnVar9->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar9,local_158.err,"%s \"%s\" failed",local_158.failed,path.len);
        }
        clcf = dir.data;
        if ((uint)local_158.err < 0x29) {
          nVar4 = 0x193;
          if ((0x1000102000U >> ((ulong)(uint)local_158.err & 0x3f) & 1) != 0) {
            sVar7 = path.len;
            if (local_158.err == 0xd) {
              pnVar9 = r->connection->log;
              if (pnVar9->log_level < 4) {
                return 0x193;
              }
              fmt = "\"%s\" is forbidden";
              level = 4;
              err = 0xd;
            }
            else {
              nVar4 = 0x194;
              if (*(long *)(dir.data + 0x1e0) == 0) {
                return 0x194;
              }
              pnVar9 = r->connection->log;
              if (pnVar9->log_level < 4) {
                return 0x194;
              }
              fmt = "\"%s\" is not found";
              level = 4;
              err = local_158.err;
            }
            goto LAB_00166567;
          }
          if ((0x10080000000U >> ((ulong)(uint)local_158.err & 0x3f) & 1) != 0) {
            return 0x193;
          }
        }
        if ((path.data._4_4_ & 1) != 0) {
          if (((u_char *)path.len == __dest + -1) ||
             (uVar6 = '/', puVar11 = __dest + -1, __dest[-1] != '/')) {
            uVar6 = *__dest;
            puVar11 = __dest;
          }
          path.data._4_1_ = uVar6;
          *puVar11 = '\0';
          local_68 = (undefined1  [8])((long)puVar11 - path.len);
          dir.len = path.len;
          pnVar9 = r->connection->log;
          if ((pnVar9->log_level & 0x100) != 0) {
            ngx_log_error_core(8,pnVar9,0,"http index check dir: \"%V\"",local_68);
          }
          uri.data = (u_char *)0x0;
          auStack_1c8 = (undefined1  [8])0x0;
          uri.len = 0;
          nVar5 = ngx_http_set_disable_symlinks
                            (r,(ngx_http_core_loc_conf_t *)clcf,(ngx_str_t *)local_68,
                             (ngx_open_file_info_t *)auStack_1c8);
          nVar4 = 500;
          if (nVar5 != 0) {
            return 500;
          }
          nVar5 = ngx_open_cached_file
                            (*(ngx_open_file_cache_t **)(clcf + 600),(ngx_str_t *)local_68,
                             (ngx_open_file_info_t *)auStack_1c8,r->pool);
          if (nVar5 != 0) {
            return 500;
          }
          *puVar11 = path.data._4_1_;
          pnVar9 = r->connection->log;
          if (pnVar9->log_level < 2) {
            return 500;
          }
          fmt = "\"%s\" is not a directory";
          level = 2;
          sVar7 = dir.len;
          err = 0;
LAB_00166567:
          ngx_log_error_core(level,pnVar9,err,fmt,sVar7);
          return nVar4;
        }
        if (local_158.err != 2) {
          pnVar9 = r->connection->log;
          if (pnVar9->log_level < 3) {
            return 500;
          }
          ngx_log_error_core(3,pnVar9,local_158.err,"%s \"%s\" failed",local_158.failed,path.len);
          return 500;
        }
        e.request = (ngx_http_request_t *)((long)&(e.request)->signature + 1);
        uVar8 = 0;
      } while (e.request < *(ngx_http_request_t **)(*local_70 + 8));
    }
  }
  return -5;
}

Assistant:

static ngx_int_t
ngx_http_index_handler(ngx_http_request_t *r)
{
    u_char                       *p, *name;
    size_t                        len, root, reserve, allocated;
    ngx_int_t                     rc;
    ngx_str_t                     path, uri;
    ngx_uint_t                    i, dir_tested;
    ngx_http_index_t             *index;
    ngx_open_file_info_t          of;
    ngx_http_script_code_pt       code;
    ngx_http_script_engine_t      e;
    ngx_http_core_loc_conf_t     *clcf;
    ngx_http_index_loc_conf_t    *ilcf;
    ngx_http_script_len_code_pt   lcode;

    if (r->uri.data[r->uri.len - 1] != '/') {
        return NGX_DECLINED;
    }

    if (!(r->method & (NGX_HTTP_GET|NGX_HTTP_HEAD|NGX_HTTP_POST))) {
        return NGX_DECLINED;
    }

    ilcf = ngx_http_get_module_loc_conf(r, ngx_http_index_module);
    clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);

    allocated = 0;
    root = 0;
    dir_tested = 0;
    name = NULL;
    /* suppress MSVC warning */
    path.data = NULL;

    index = ilcf->indices->elts;
    for (i = 0; i < ilcf->indices->nelts; i++) {

        if (index[i].lengths == NULL) {

            if (index[i].name.data[0] == '/') {
                return ngx_http_internal_redirect(r, &index[i].name, &r->args);
            }

            reserve = ilcf->max_index_len;
            len = index[i].name.len;

        } else {
            ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

            e.ip = index[i].lengths->elts;
            e.request = r;
            e.flushed = 1;

            /* 1 is for terminating '\0' as in static names */
            len = 1;

            while (*(uintptr_t *) e.ip) {
                lcode = *(ngx_http_script_len_code_pt *) e.ip;
                len += lcode(&e);
            }

            /* 16 bytes are preallocation */

            reserve = len + 16;
        }

        if (reserve > allocated) {

            name = ngx_http_map_uri_to_path(r, &path, &root, reserve);
            if (name == NULL) {
                return NGX_ERROR;
            }

            allocated = path.data + path.len - name;
        }

        if (index[i].values == NULL) {

            /* index[i].name.len includes the terminating '\0' */

            ngx_memcpy(name, index[i].name.data, index[i].name.len);

            path.len = (name + index[i].name.len - 1) - path.data;

        } else {
            e.ip = index[i].values->elts;
            e.pos = name;

            while (*(uintptr_t *) e.ip) {
                code = *(ngx_http_script_code_pt *) e.ip;
                code((ngx_http_script_engine_t *) &e);
            }

            if (*name == '/') {
                uri.len = len - 1;
                uri.data = name;
                return ngx_http_internal_redirect(r, &uri, &r->args);
            }

            path.len = e.pos - path.data;

            *e.pos = '\0';
        }

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "open index \"%V\"", &path);

        ngx_memzero(&of, sizeof(ngx_open_file_info_t));

        of.read_ahead = clcf->read_ahead;
        of.directio = clcf->directio;
        of.valid = clcf->open_file_cache_valid;
        of.min_uses = clcf->open_file_cache_min_uses;
        of.test_only = 1;
        of.errors = clcf->open_file_cache_errors;
        of.events = clcf->open_file_cache_events;

        if (ngx_http_set_disable_symlinks(r, clcf, &path, &of) != NGX_OK) {
            return NGX_HTTP_INTERNAL_SERVER_ERROR;
        }

        if (ngx_open_cached_file(clcf->open_file_cache, &path, &of, r->pool)
            != NGX_OK)
        {
            if (of.err == 0) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, of.err,
                           "%s \"%s\" failed", of.failed, path.data);

#if (NGX_HAVE_OPENAT)
            if (of.err == NGX_EMLINK
                || of.err == NGX_ELOOP)
            {
                return NGX_HTTP_FORBIDDEN;
            }
#endif

            if (of.err == NGX_ENOTDIR
                || of.err == NGX_ENAMETOOLONG
                || of.err == NGX_EACCES)
            {
                return ngx_http_index_error(r, clcf, path.data, of.err);
            }

            if (!dir_tested) {
                rc = ngx_http_index_test_dir(r, clcf, path.data, name - 1);

                if (rc != NGX_OK) {
                    return rc;
                }

                dir_tested = 1;
            }

            if (of.err == NGX_ENOENT) {
                continue;
            }

            ngx_log_error(NGX_LOG_CRIT, r->connection->log, of.err,
                          "%s \"%s\" failed", of.failed, path.data);

            return NGX_HTTP_INTERNAL_SERVER_ERROR;
        }

        uri.len = r->uri.len + len - 1;

        if (!clcf->alias) {
            uri.data = path.data + root;

        } else {
            uri.data = ngx_pnalloc(r->pool, uri.len);
            if (uri.data == NULL) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            p = ngx_copy(uri.data, r->uri.data, r->uri.len);
            ngx_memcpy(p, name, len - 1);
        }

        return ngx_http_internal_redirect(r, &uri, &r->args);
    }

    return NGX_DECLINED;
}